

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitForExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ForExpr *expr)

{
  ostream *poVar1;
  type expr_00;
  type expr_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  ForExpr *local_20;
  ForExpr *expr_local;
  AstSerialise *this_local;
  
  local_20 = expr;
  expr_local = (ForExpr *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,(string *)&this->m_ident);
  poVar1 = std::operator<<(poVar1,"(Expr::For (");
  poVar1 = std::operator<<(poVar1,(string *)&(local_20->name).lexeme);
  poVar1 = std::operator<<(poVar1," ");
  expr_00 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                      (&local_20->object);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_1d8,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,expr_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d8);
  std::operator<<(poVar1,")\n");
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  expr_01 = std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::operator*
                      (&local_20->body);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr(&local_1f8,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,&expr_01->super_Expr);
  std::operator<<(local_198,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  poVar1 = std::operator<<(local_198,(string *)&this->m_ident);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitForExpr(ForExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::For (" << expr.name.lexeme << " " << visitExpr(*expr.object) << ")\n";
        m_ident += "    ";

        s << visitExpr(*expr.body);

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }